

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateIdentifier.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::AggregateIdentifier::AggregateIdentifier
          (AggregateIdentifier *this,AggregateIdentifier *param_1)

{
  AggregateIdentifier *param_1_local;
  AggregateIdentifier *this_local;
  
  SimulationIdentifier::SimulationIdentifier
            (&this->super_SimulationIdentifier,&param_1->super_SimulationIdentifier);
  (this->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__AggregateIdentifier_00330288;
  *(undefined2 *)&(this->super_SimulationIdentifier).field_0xc =
       *(undefined2 *)&(param_1->super_SimulationIdentifier).field_0xc;
  return;
}

Assistant:

class KDIS_EXPORT AggregateIdentifier : public SimulationIdentifier
{
protected:

    KUINT16 m_ui16AggregateID;

public:

    static const KUINT16 AGGREGATE_IDENTIFER_SIZE = 6;

    AggregateIdentifier();

    AggregateIdentifier( KUINT16 SiteID, KUINT16 ApplicatonID, KUINT16 AggregateID );

    AggregateIdentifier( const SimulationIdentifier & SimID, KUINT16 AggregateID );

    AggregateIdentifier(KDataStream &stream) noexcept(false);

    virtual ~AggregateIdentifier();

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateIdentifier::SetAggregateID
    //              KDIS::DATA_TYPE::AggregateIdentifier::GetAggregateID
    // Description: Aggregate ID
    // Parameter:   KUINT16 ID, void
    //************************************
    void SetAggregateID( KUINT16 ID );
    KUINT16 GetAggregateID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateIdentifier::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateIdentifier::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateIdentifier::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const AggregateIdentifier & Value ) const;
    KBOOL operator != ( const AggregateIdentifier & Value ) const;
    KBOOL operator  < ( const AggregateIdentifier & Value ) const;
}